

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O0

void ur_pp2(double *x,int N,char *type,char *model,int lshort,int *klag,double *cval,double *cprobs,
           double *auxstat,int *laux,double *teststat)

{
  int iVar1;
  reg_object prVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  reg_object fit;
  double beta_stat;
  double my_stat;
  double M;
  double lambda_prime;
  double lambda;
  double sig;
  double sum_y;
  double my;
  double mty;
  double myy;
  double myybar;
  double tstat;
  double ymean;
  double sum_y2;
  double sum_ymy;
  double sum_res;
  double s;
  double beta_tstat;
  double my_tstat;
  double at;
  double N1d;
  int local_a0;
  int iter;
  int len;
  int N12;
  int p;
  int i;
  int lmax;
  int N1;
  int *idx;
  double *weights;
  double *coprods;
  double *tt;
  double *res;
  double *varcovar;
  double *XX;
  double *trend;
  double *y_li;
  double *y;
  int *klag_local;
  char *pcStack_28;
  int lshort_local;
  char *model_local;
  char *type_local;
  double *pdStack_10;
  int N_local;
  double *x_local;
  
  i = N + -1;
  y_li = x + 1;
  trend = x;
  y = (double *)klag;
  klag_local._4_4_ = lshort;
  pcStack_28 = model;
  model_local = type;
  type_local._4_4_ = N;
  pdStack_10 = x;
  if (lshort == 1) {
    dVar4 = pow((double)i / 100.0,0.25);
    dVar4 = dVar4 * 4.0;
  }
  else {
    dVar4 = pow((double)i / 100.0,0.25);
    dVar4 = dVar4 * 12.0;
  }
  p = (int)dVar4;
  if ((y != (double *)0x0) && (0 < *(int *)y)) {
    p = *(int *)y;
  }
  iVar1 = strcmp(pcStack_28,"trend");
  if (iVar1 == 0) {
    *cval = (-3.9638 - 8.353 / (double)i) - 47.44 / (double)(i * i);
    cval[1] = (-3.4126 - 4.039 / (double)i) - 17.83 / (double)(i * i);
    cval[2] = (-3.1279 - 2.418 / (double)i) - 7.58 / (double)(i * i);
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    XX = (double *)malloc((long)i << 3);
    coprods = (double *)malloc((long)i << 3);
    at = (double)i / 2.0;
    for (N12 = 1; N12 <= i; N12 = N12 + 1) {
      XX[N12 + -1] = (double)N12 - at;
      coprods[N12 + -1] = (double)N12;
    }
    len = 3;
    res = (double *)malloc(0x48);
    varcovar = (double *)malloc((long)i << 4);
    tt = (double *)malloc((long)i << 3);
    memcpy(varcovar,trend,(long)i << 3);
    memcpy(varcovar + i,XX,(long)i << 3);
    my_tstat = 0.95;
    prVar2 = reg_init(i,len);
    regress(prVar2,varcovar,y_li,tt,res,my_tstat);
    beta_tstat = prVar2->beta[0].value / prVar2->beta[0].stdErr;
    s = prVar2[1].sigma_upper / prVar2[1].R2[0];
    sum_ymy = 0.0;
    sum_y2 = 0.0;
    ymean = 0.0;
    sig = 0.0;
    my = 0.0;
    tstat = mean(y_li,i);
    iter = i * i;
    for (N12 = 0; N12 < i; N12 = N12 + 1) {
      sum_ymy = tt[N12] * tt[N12] + sum_ymy;
      sum_y2 = (y_li[N12] - tstat) * (y_li[N12] - tstat) + sum_y2;
      ymean = y_li[N12] * y_li[N12] + ymean;
      my = coprods[N12] * y_li[N12] + my;
      sig = y_li[N12] + sig;
    }
    sum_res = (1.0 / (double)i) * sum_ymy;
    myy = (1.0 / (double)iter) * sum_y2;
    mty = (1.0 / (double)iter) * ymean;
    dVar4 = pow((double)i,-2.5);
    my = dVar4 * my;
    dVar4 = pow((double)i,-1.5);
    sum_y = dVar4 * sig;
    _lmax = malloc((long)p << 2);
    weights = (double *)malloc((long)p << 3);
    idx = (int *)malloc((long)p << 3);
    for (N12 = 0; N12 < p; N12 = N12 + 1) {
      *(int *)((long)_lmax + (long)N12 * 4) = N12 + 1;
    }
    for (N12 = 0; N12 < p; N12 = N12 + 1) {
      N1d._4_4_ = *(int *)((long)_lmax + (long)N12 * 4);
      local_a0 = i - N1d._4_4_;
      mmult(tt + N1d._4_4_,tt,weights + N12,1,local_a0,1);
    }
    for (N12 = 0; N12 < p; N12 = N12 + 1) {
      *(double *)(idx + (long)N12 * 2) =
           1.0 - (double)*(int *)((long)_lmax + (long)N12 * 4) / (double)(p + 1);
    }
    mmult((double *)idx,weights,&lambda,1,p,1);
    lambda = sum_res + (lambda * 2.0) / (double)i;
    dVar5 = (lambda - sum_res) * 0.5;
    dVar6 = dVar5 / lambda;
    dVar4 = pow((double)i,-2.0);
    dVar7 = -((6.0 / (double)i + 4.0 + 2.0 / (double)(i * i)) * sum_y) * sum_y +
            (1.0 / (double)i + 1.0) * 12.0 * my * sum_y + (1.0 - dVar4) * mty + -(my * 12.0 * my);
    dVar8 = sqrt(sum_res / lambda);
    dVar16 = beta_tstat;
    dVar4 = sqrt(lambda);
    dVar9 = dVar6 * dVar4 * sum_y;
    dVar10 = sqrt(dVar7);
    dVar11 = sqrt(sum_y * sum_y + dVar7);
    dVar12 = sqrt(sum_res / lambda);
    dVar4 = s;
    dVar13 = sqrt(lambda);
    dVar3 = -my;
    dVar17 = sum_y * 0.5;
    dVar14 = sqrt(dVar7 / 12.0);
    dVar15 = sqrt(myy);
    *auxstat = dVar8 * dVar16 + -(dVar9 / (dVar10 * dVar11));
    auxstat[1] = dVar12 * dVar4 + -((dVar6 * dVar13 * (dVar17 + dVar3)) / (dVar14 * dVar15));
    *laux = 2;
    iVar1 = strcmp(model_local,"Z-tau");
    if (iVar1 == 0) {
      myybar = (*(double *)(prVar2 + 1) - 1.0) / prVar2[1].sigma_lower;
      dVar16 = sqrt(sum_res / lambda);
      dVar4 = myybar;
      dVar3 = sqrt(lambda);
      dVar5 = sqrt(dVar7);
      *teststat = dVar16 * dVar4 + -((dVar6 * dVar3) / dVar5);
    }
    else {
      iVar1 = strcmp(model_local,"Z-alpha");
      if (iVar1 == 0) {
        *teststat = (double)i * (*(double *)(prVar2 + 1) - 1.0) + -(dVar5 / dVar7);
        cval[2] = NAN;
        cval[1] = NAN;
        *cval = NAN;
      }
    }
    free(XX);
    free(res);
    free(varcovar);
    free(tt);
    free(coprods);
    free(_lmax);
    free(weights);
    free(idx);
    free_reg(prVar2);
  }
  else {
    iVar1 = strcmp(pcStack_28,"constant");
    if (iVar1 == 0) {
      *cval = (-3.4335 - 5.999 / (double)i) - 29.25 / (double)(i * i);
      cval[1] = (-2.8621 - 2.738 / (double)i) - 8.36 / (double)(i * i);
      cval[2] = (-2.5671 - 1.438 / (double)i) - 4.48 / (double)(i * i);
      *cprobs = 0.01;
      cprobs[1] = 0.05;
      cprobs[2] = 0.1;
      len = 2;
      res = (double *)malloc(0x20);
      varcovar = (double *)malloc((long)i << 3);
      tt = (double *)malloc((long)i << 3);
      memcpy(varcovar,trend,(long)i << 3);
      my_tstat = 0.95;
      prVar2 = reg_init(i,len);
      regress(prVar2,varcovar,y_li,tt,res,my_tstat);
      beta_tstat = prVar2->beta[0].value / prVar2->beta[0].stdErr;
      sum_ymy = 0.0;
      sum_y2 = 0.0;
      ymean = 0.0;
      sig = 0.0;
      tstat = mean(y_li,i);
      iter = i * i;
      for (N12 = 0; N12 < i; N12 = N12 + 1) {
        sum_ymy = tt[N12] * tt[N12] + sum_ymy;
        sum_y2 = (y_li[N12] - tstat) * (y_li[N12] - tstat) + sum_y2;
        ymean = y_li[N12] * y_li[N12] + ymean;
        sig = y_li[N12] + sig;
      }
      sum_res = (1.0 / (double)i) * sum_ymy;
      myy = (1.0 / (double)iter) * sum_y2;
      mty = (1.0 / (double)iter) * ymean;
      dVar4 = pow((double)i,-1.5);
      sum_y = dVar4 * sig;
      _lmax = malloc((long)p << 2);
      weights = (double *)malloc((long)p << 3);
      idx = (int *)malloc((long)p << 3);
      for (N12 = 0; N12 < p; N12 = N12 + 1) {
        *(int *)((long)_lmax + (long)N12 * 4) = N12 + 1;
      }
      for (N12 = 0; N12 < p; N12 = N12 + 1) {
        N1d._4_4_ = *(int *)((long)_lmax + (long)N12 * 4);
        local_a0 = i - N1d._4_4_;
        mmult(tt + N1d._4_4_,tt,weights + N12,1,local_a0,1);
      }
      for (N12 = 0; N12 < p; N12 = N12 + 1) {
        *(double *)(idx + (long)N12 * 2) =
             1.0 - (double)*(int *)((long)_lmax + (long)N12 * 4) / (double)(p + 1);
      }
      mmult((double *)idx,weights,&lambda,1,p,1);
      lambda = sum_res + (lambda * 2.0) / (double)i;
      dVar16 = (lambda - sum_res) * 0.5;
      dVar3 = dVar16 / lambda;
      dVar5 = sqrt(sum_res / lambda);
      dVar4 = beta_tstat;
      dVar6 = sqrt(lambda);
      dVar6 = dVar3 * dVar6 * sum_y;
      dVar7 = sqrt(mty);
      dVar8 = sqrt(myy);
      *auxstat = dVar5 * dVar4 + -(dVar6 / (dVar7 * dVar8));
      *laux = 1;
      iVar1 = strcmp(model_local,"Z-tau");
      if (iVar1 == 0) {
        myybar = (*(double *)(prVar2 + 1) - 1.0) / prVar2[1].sigma_lower;
        dVar16 = sqrt(sum_res / lambda);
        dVar4 = myybar;
        dVar5 = sqrt(lambda);
        dVar6 = sqrt(myy);
        *teststat = dVar16 * dVar4 + -((dVar3 * dVar5) / dVar6);
      }
      else {
        iVar1 = strcmp(model_local,"Z-alpha");
        if (iVar1 == 0) {
          *teststat = (double)i * (*(double *)(prVar2 + 1) - 1.0) + -(dVar16 / myy);
          cval[2] = NAN;
          cval[1] = NAN;
          *cval = NAN;
        }
      }
      free(res);
      free(varcovar);
      free(tt);
      free(_lmax);
      free(weights);
      free(idx);
      free_reg(prVar2);
    }
  }
  return;
}

Assistant:

void ur_pp2(double *x, int N,const char* type,const char* model,int lshort, int *klag,double *cval,double *cprobs, double *auxstat,int *laux,double *teststat) {
    /* 
    ur_pp2
    C version of the R code by
    Bernhard Pfaff [aut, cre], Eric Zivot [ctb], Matthieu Stigler [ctb]. urca: Unit Root and Cointegration Tests for Time Series Data
    License Information : https://cran.r-project.org/web/packages/urca/urca.pdf
    */
    double *y,*y_li,*trend,*XX,*varcovar,*res,*tt,*coprods,*weights;
    int *idx;
    int N1, lmax, i,p, N12,len,iter;
    double N1d,at,my_tstat,beta_tstat,s,sum_res,sum_ymy,sum_y2,ymean,tstat;
    double myybar,myy,mty,my,sum_y,sig,lambda,lambda_prime,M,my_stat,beta_stat;
    reg_object fit;

    N1 = N - 1;
    y = &x[1];// length N1
    y_li = &x[0];// Length N1

    if (lshort == 1) {
        lmax = (int) 4.0 * pow(((double) N1)/100.0,0.25);
    } else {
        lmax = (int) 12.0 * pow(((double) N1)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        lmax = *klag;
    }

    if (!strcmp(model,"trend")) {
        cval[0] = -3.9638-8.353/N1-47.44/(N1*N1);
        cval[1] = -3.4126-4.039/N1-17.83/(N1*N1);
        cval[2] = -3.1279-2.418/N1-7.58/(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);
        trend = (double*)malloc(sizeof(double)*N1);
        tt = (double*)malloc(sizeof(double)*N1);
        N1d = (double) N1 / 2.0;

        for(i = 1; i <= N1;++i) {
            trend[i-1] = (double)i - N1d;
            tt[i-1] = (double) i;
        } 

        p = 3;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*2*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);
        memcpy(XX+N1,trend,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        /*summary(fit);
        anova(fit);
        mdisplay(res,1,N1);
        mdisplay(XX,2,N1);
        mdisplay(y,1,N1);
        */

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;
        beta_tstat = (fit->beta+2)->value/(fit->beta+2)->stdErr;

        //printf("c1 %g c2 %g \n",my_tstat,beta_tstat);

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;
        mty = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            mty += (tt[i]*y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        mty = pow((double)N1, -2.5) * mty;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g c2 %g s %g sum_ymy %g sum_y2 %g mty %g my %g \n",my_tstat,beta_tstat,s,myybar,myy,mty,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;
        M = (1-pow((double)N1, -2.0))*myy - 12*mty*mty + 12.0*(1.0 + 1.0/(double)N1)*mty*my - (4 + 6/(double)N1 + 2/(double)(N1*N1))*my*my;
        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(M)*sqrt((M+my*my)));
        beta_stat = sqrt(s/sig)*beta_tstat - lambda_prime*sqrt(sig)*(0.5*my - mty)/(sqrt(M/12)*sqrt(myybar));
        auxstat[0] = my_stat;
        auxstat[1] = beta_stat;

        *laux = 2;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(M);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/M;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g M %g my_stat %g beta_stat %g teststat %g \n",sig,lambda,lambda_prime,M,my_stat,beta_stat,*teststat);


        free(trend);
        free(varcovar);
        free(XX);
        free(res);
        free(tt);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    } else if (!strcmp(model,"constant")) {
        cval[0] = -3.4335-5.999/(double)N1-29.25/(double)(N1*N1);
        cval[1] = -2.8621-2.738/(double)N1-8.36/(double)(N1*N1);
        cval[2] = -2.5671-1.438/(double)N1-4.48/(double)(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);

        p = 2;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        //summary(fit);
        //anova(fit);
        //mdisplay(res,1,N1);
        //mdisplay(XX,2,N1);
        //mdisplay(y,1,N1);

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g s %g sum_ymy %g sum_y2 %g my %g \n",my_tstat,s,myybar,myy,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(coprods,1,lmax);

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;

        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(myy)*sqrt(myybar));
        auxstat[0] = my_stat;
        *laux = 1;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(myybar);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/myybar;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g my_stat %g teststat %g \n",sig,lambda,lambda_prime,my_stat,*teststat);
        



        free(varcovar);
        free(XX);
        free(res);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    }
}